

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O0

void mcode_protfail(jit_State *J)

{
  code *pcVar1;
  TValue *pTVar2;
  GCstr *pGVar3;
  long in_RDI;
  lua_State *L;
  lua_CFunction panic;
  lua_State *L_00;
  
  pcVar1 = *(code **)(in_RDI + -0xd0);
  if (pcVar1 != (code *)0x0) {
    L_00 = *(lua_State **)(in_RDI + 0x68);
    pTVar2 = L_00->top;
    L_00->top = pTVar2 + 1;
    pGVar3 = lj_err_str(L_00,(ErrMsg)((ulong)pTVar2 >> 0x20));
    (pTVar2->u32).lo = (uint32_t)pGVar3;
    (pTVar2->field_2).it = 0xfffffffb;
    (*pcVar1)(L_00);
  }
  exit(1);
}

Assistant:

void mcode_protfail(jit_State *J)
{
  lua_CFunction panic = J2G(J)->panic;
  if (panic) {
    lua_State *L = J->L;
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITPROT));
    panic(L);
  }
  exit(EXIT_FAILURE);
}